

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_addx_8_mm_ay7(void)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint address;
  
  uVar1 = OPER_A7_PD_8();
  uVar3 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
  address = *(int *)((long)m68ki_cpu.dar + uVar3 + 0x20) - 1;
  *(uint *)((long)m68ki_cpu.dar + uVar3 + 0x20) = address;
  uVar2 = m68ki_read_8_fc(address,m68ki_address_space | m68ki_cpu.s_flag);
  m68ki_cpu.x_flag = uVar2 + uVar1 + (uint)((m68ki_cpu.x_flag >> 8 & 1) != 0);
  m68ki_cpu.v_flag = (uVar2 ^ m68ki_cpu.x_flag) & (uVar1 ^ m68ki_cpu.x_flag);
  m68ki_cpu.not_z_flag = m68ki_cpu.not_z_flag | m68ki_cpu.x_flag & 0xff;
  m68ki_cpu.n_flag = m68ki_cpu.x_flag;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  m68ki_write_8_fc(address,m68ki_cpu.s_flag | 1,m68ki_cpu.x_flag & 0xff);
  return;
}

Assistant:

static void m68k_op_addx_8_mm_ay7(void)
{
	uint src = OPER_A7_PD_8();
	uint ea  = EA_AX_PD_8();
	uint dst = m68ki_read_8(ea);
	uint res = src + dst + XFLAG_AS_1();

	FLAG_N = NFLAG_8(res);
	FLAG_V = VFLAG_ADD_8(src, dst, res);
	FLAG_X = FLAG_C = CFLAG_8(res);

	res = MASK_OUT_ABOVE_8(res);
	FLAG_Z |= res;

	m68ki_write_8(ea, res);
}